

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O3

Parse_ast * __thiscall
lambda::parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
          (Parse_ast *__return_storage_ptr__,void *this,Parse_ast *fst)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  Parse_ast *extraout_RAX;
  Parse_ast *extraout_RAX_00;
  undefined8 *puVar6;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  *this_00;
  string_view s;
  string local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  undefined8 local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  Call local_198;
  Call local_188;
  Shared_string local_178;
  anon_class_8_1_a78179b7 local_160;
  undefined1 local_158 [40];
  __index_type local_130;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_128;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_f8;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_c8;
  _Variadic_union<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_98;
  undefined1 local_70;
  _Variadic_union<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_68;
  undefined1 local_40;
  
  parse_from::helper::eat_whitespace((helper *)this);
  iVar4 = std::istream::peek();
  if (iVar4 < 0x29) {
    if (iVar4 == -1) {
LAB_0010355b:
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)__return_storage_ptr__,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)fst);
      return extraout_RAX;
    }
    if (iVar4 == 0x28) {
      local_c8._M_index =
           *(__index_type *)
            ((long)&(fst->underlying_).
                    super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                    .
                    super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                    .
                    super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                    .
                    super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                    .
                    super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                    .
                    super__Variant_storage_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
            + 0x28);
      local_160.__lhs =
           (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
            *)&local_c8;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>_&&>
        ::_S_vtable._M_arr[(long)(char)local_c8._M_index + 1]._M_data)(&local_160,&fst->underlying_)
      ;
      parse_from::helper::parse_term((Parse_ast *)&local_f8,(helper *)this);
      Parse_ast::Call::Call(&local_188,(Parse_ast *)&local_c8,(Parse_ast *)&local_f8);
      local_68._8_8_ = local_188.argument_;
      local_68._0_8_ = local_188.callee_;
      local_188.callee_._M_t.
      super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
      super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
      super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
           (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
           (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
      local_188.argument_._M_t.
      super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
      super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
      super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
           (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
           (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
      local_40 = 1;
      Parse_ast_(__return_storage_ptr__,this,(Parse_ast *)&local_68._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)&local_68._M_first);
      std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
                (&local_188.argument_);
      std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
                (&local_188.callee_);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_f8);
      this_00 = &local_c8;
      goto LAB_00103709;
    }
  }
  else {
    if (iVar4 == 0x29) goto LAB_0010355b;
    if ((iVar4 == 0x2f) || (iVar4 == 0x5c)) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x20);
      s._M_str = "attempted to define a lambda in a callee";
      s._M_len = 0x28;
      ublib::Shared_string::Shared_string(&local_178,s);
      *puVar6 = &PTR__Parse_error_00109ba8;
      puVar6[1] = local_178.length_;
      uVar2 = local_178.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._0_4_;
      uVar3 = local_178.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_;
      local_178.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(undefined4 *)(puVar6 + 2) =
           local_178.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr
           ._0_4_;
      *(undefined4 *)((long)puVar6 + 0x14) =
           local_178.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr
           ._4_4_;
      *(undefined4 *)(puVar6 + 3) = uVar2;
      *(undefined4 *)((long)puVar6 + 0x1c) = uVar3;
      local_178.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      __cxa_throw(puVar6,&Parse_error::typeinfo,Parse_error::~Parse_error);
    }
  }
  iVar5 = isalpha(iVar4);
  if ((iVar4 != 0x5f) && (iVar5 == 0)) {
    parse_from::helper::unexpected_thing(*this);
  }
  local_128._M_index =
       *(__index_type *)
        ((long)&(fst->underlying_).
                super__Variant_base<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                .
                super__Move_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                .
                super__Copy_assign_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                .
                super__Move_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                .
                super__Copy_ctor_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                .
                super__Variant_storage_alias<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
        + 0x28);
  local_160.__lhs =
       (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
        *)&local_128;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>_&&>
    ::_S_vtable._M_arr[(long)(char)local_128._M_index + 1]._M_data)(&local_160,&fst->underlying_);
  parse_from(std::istream&)::helper::get_var_abi_cxx11_(&local_1d8,this);
  local_158._8_8_ = local_1d8._M_string_length;
  paVar1 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p == paVar1) {
    local_1a8._8_8_ = local_1d8.field_2._8_8_;
    local_1d8._M_dataplus._M_p = (pointer)&local_1a8;
  }
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_158._0_8_ = local_1d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p == &local_1a8) {
    local_158._24_8_ = local_1a8._8_8_;
    local_158._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_158 + 0x10);
  }
  local_1b0 = 0;
  local_1a8._M_allocated_capacity = (ulong)(uint7)local_1d8.field_2._M_allocated_capacity._1_7_ << 8
  ;
  local_130 = '\0';
  local_1d8._M_dataplus._M_p = (pointer)paVar1;
  local_1b8 = &local_1a8;
  Parse_ast::Call::Call(&local_198,(Parse_ast *)&local_128,(Parse_ast *)local_158);
  local_98._8_8_ =
       local_198.argument_._M_t.
       super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
       super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
       super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl;
  local_98._0_8_ =
       local_198.callee_._M_t.
       super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
       super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
       super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl;
  local_198.callee_._M_t.
  super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
  super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
  super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
       (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
       (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
  local_198.argument_._M_t.
  super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
  super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
  super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
       (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
       (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
  local_70 = 1;
  Parse_ast_(__return_storage_ptr__,this,(Parse_ast *)&local_98._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)&local_98._M_first);
  std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
            (&local_198.argument_);
  std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
            (&local_198.callee_);
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)local_158);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  this_00 = &local_128;
LAB_00103709:
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage(this_00);
  return extraout_RAX_00;
}

Assistant:

Parse_ast parse_app_list(Parse_ast fst) {
      eat_whitespace();
      auto ch = inp.peek();

      switch (ch) {
      case ')':
      case eof:
        return fst;
      case '(': {
        return parse_app_list(Parse_ast::Call(std::move(fst), parse_term()));
      }
      case '/':
      case '\\':
        throw Parse_error("attempted to define a lambda in a callee");
      default:
        if (std::isalpha(ch) or ch == '_') {
          return parse_app_list(
              Parse_ast::Call(std::move(fst), Parse_ast::Variable(get_var())));
        } else {
          unexpected_thing();
        }
      }
    }